

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

secp256k1_xonly_pubkey *
cfd::core::GetXOnlyPubkeyFromPubkey
          (secp256k1_xonly_pubkey *__return_storage_ptr__,secp256k1_pubkey *pubkey,bool *parity)

{
  CfdException *this;
  allocator local_49;
  string local_48;
  int local_28;
  int local_24;
  int ret;
  int pk_parity;
  secp256k1_context_struct *ctx;
  bool *parity_local;
  secp256k1_pubkey *pubkey_local;
  
  ctx = (secp256k1_context_struct *)parity;
  parity_local = (bool *)pubkey;
  _ret = wally_get_secp_context();
  local_24 = 0;
  local_28 = secp256k1_xonly_pubkey_from_pubkey
                       (_ret,__return_storage_ptr__,&local_24,(secp256k1_pubkey *)parity_local);
  if (local_28 != 1) {
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_48,"Could not get xonly pubkey from pubkey",&local_49);
    CfdException::CfdException(this,kCfdInternalError,&local_48);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (ctx != (secp256k1_context_struct *)0x0) {
    *(bool *)&(ctx->ecmult_ctx).pre_g = local_24 != 0;
  }
  return __return_storage_ptr__;
}

Assistant:

secp256k1_xonly_pubkey GetXOnlyPubkeyFromPubkey(
    const secp256k1_pubkey& pubkey, bool* parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;
  int pk_parity = 0;

  auto ret = secp256k1_xonly_pubkey_from_pubkey(
      ctx, &xonly_pubkey, &pk_parity, &pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not get xonly pubkey from pubkey");
  }
  if (parity != nullptr) *parity = (pk_parity != 0);

  return xonly_pubkey;
}